

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  FileOptions_OptimizeMode FVar3;
  LogMessage *pLVar4;
  string *value;
  value_type pFVar5;
  FieldGenerator *pFVar6;
  OneofDescriptor *pOVar7;
  FileDescriptor *pFVar8;
  pointer pPVar9;
  MessageOptions *pMVar10;
  FileOptions *this_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX_01;
  Descriptor *descriptor;
  size_type in_R9;
  Iterator IVar11;
  StringPiece has_bits_var;
  string local_280;
  Formatter local_260;
  undefined1 local_228 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  SaveState saver;
  value_type field_2;
  Iterator __end3_2;
  Iterator __begin3_2;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3_2;
  value_type field_1;
  Iterator __end3_1;
  Iterator __begin3_1;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3_1;
  char *local_148;
  string local_140;
  undefined1 local_120 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  string local_100;
  LogFinisher local_da;
  byte local_d9;
  LogMessage local_d8;
  int local_9c;
  value_type pFStack_98;
  int has_bit_index;
  value_type field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  bVar1 = IsMapEntryMessage(this->descriptor_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "$classname$::$classname$() {}\n$classname$::$classname$(::$proto_ns$::Arena* arena)\n    : SuperType(arena) {}\nvoid $classname$::MergeFrom(const $classname$& other) {\n  MergeFromInternal(other);\n}\n"
              );
    pFVar8 = Descriptor::file(this->descriptor_);
    bVar1 = HasDescriptorMethods(pFVar8,&this->options_);
    if (bVar1) {
      pMVar10 = Descriptor::options(this->descriptor_);
      bVar1 = MessageOptions::map_entry(pMVar10);
      if (bVar1) {
        Formatter::operator()
                  ((Formatter *)local_50,
                   "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
                   ,&this->index_in_file_messages_);
      }
      else {
        Formatter::operator()
                  ((Formatter *)local_50,
                   "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n$annotate_reflection$  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
                   ,&this->index_in_file_messages_);
      }
    }
  }
  else {
    bVar1 = IsAnyMessage(this->descriptor_,&this->options_);
    if (bVar1) {
      pFVar8 = Descriptor::file(this->descriptor_);
      bVar1 = HasDescriptorMethods(pFVar8,&this->options_);
      if (bVar1) {
        Formatter::operator()<>
                  ((Formatter *)local_50,
                   "bool $classname$::GetAnyFieldDescriptors(\n    const ::$proto_ns$::Message& message,\n    const ::$proto_ns$::FieldDescriptor** type_url_field,\n    const ::$proto_ns$::FieldDescriptor** value_field) {\n  return ::$proto_ns$::internal::GetAnyFieldDescriptors(\n      message, type_url_field, value_field);\n}\n"
                  );
      }
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "bool $classname$::ParseAnyTypeUrl(\n    ::PROTOBUF_NAMESPACE_ID::ConstStringParam type_url,\n    std::string* full_type_name) {\n  return ::$proto_ns$::internal::ParseAnyTypeUrl(type_url,\n                                             full_type_name);\n}\n\n"
                );
    }
    Formatter::operator()<>((Formatter *)local_50,"class $classname$::_Internal {\n public:\n");
    Formatter::Indent((Formatter *)local_50);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
    if (!bVar1) {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "using HasBits = decltype(std::declval<$classname$>()._has_bits_);\n");
    }
    __begin3.descriptor = (Descriptor *)FieldRange<google::protobuf::Descriptor>(this->descriptor_);
    IVar11 = FieldRangeImpl<google::protobuf::Descriptor>::begin
                       ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
    __begin3._0_8_ = IVar11.descriptor;
    __end3.descriptor._0_4_ = IVar11.idx;
    IVar11 = FieldRangeImpl<google::protobuf::Descriptor>::end
                       ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
    __end3._0_8_ = IVar11.descriptor;
    field._0_4_ = IVar11.idx;
    while( true ) {
      bVar1 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&field);
      if (!bVar1) break;
      pFStack_98 = FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                             ((Iterator *)&__end3.descriptor);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFStack_98);
      (*pFVar6->_vptr_FieldGenerator[9])
                (pFVar6,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = IsFieldStripped(pFStack_98,&this->options_);
      if ((!bVar1) && (bVar1 = HasHasbit(pFStack_98), bVar1)) {
        local_9c = HasBitIndex(this,pFStack_98);
        local_d9 = 0;
        field_00 = extraout_RDX;
        if (local_9c == -1) {
          internal::LogMessage::LogMessage
                    (&local_d8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x943);
          local_d9 = 1;
          pLVar4 = internal::LogMessage::operator<<
                             (&local_d8,"CHECK failed: (has_bit_index) != (kNoHasbit): ");
          value = FieldDescriptor::full_name_abi_cxx11_(pFStack_98);
          pLVar4 = internal::LogMessage::operator<<(pLVar4,value);
          internal::LogFinisher::operator=(&local_da,pLVar4);
          field_00 = extraout_RDX_00;
        }
        if ((local_d9 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_d8);
          field_00 = extraout_RDX_01;
        }
        FieldName_abi_cxx11_(&local_100,(cpp *)pFStack_98,field_00);
        iVar2 = local_9c;
        if (local_9c < 0) {
          iVar2 = local_9c + 0x1f;
        }
        masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = iVar2 >> 5;
        masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 1 << ((byte)local_9c & 0x1f);
        Formatter::operator()
                  ((Formatter *)local_50,
                   "static void set_has_$1$(HasBits* has_bits) {\n  (*has_bits)[$2$] |= $3$u;\n}\n",
                   &local_100,
                   (int *)((long)&masks_for_has_bits.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                   (uint *)&masks_for_has_bits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&local_100);
      }
      FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
                ((Iterator *)&__end3.descriptor);
    }
    if (0 < this->num_required_fields_) {
      RequiredFieldsBitMask((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120,this);
      stringpiece_internal::StringPiece::StringPiece((StringPiece *)&__range3_1,"has_bits");
      has_bits_var.length_ = in_R9;
      has_bits_var.ptr_ = local_148;
      (anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
                (&local_140,(_anonymous_namespace_ *)local_120,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0,(bool)__range3_1._0_1_,
                 has_bits_var);
      Formatter::operator()
                ((Formatter *)local_50,
                 "static bool MissingRequiredFields(const HasBits& has_bits) {\n  return $1$;\n}\n",
                 &local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_120);
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"};\n\n");
    __begin3_1.descriptor =
         (Descriptor *)FieldRange<google::protobuf::Descriptor>(this->descriptor_);
    IVar11 = FieldRangeImpl<google::protobuf::Descriptor>::begin
                       ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3_1.descriptor);
    __begin3_1._0_8_ = IVar11.descriptor;
    __end3_1.descriptor._0_4_ = IVar11.idx;
    IVar11 = FieldRangeImpl<google::protobuf::Descriptor>::end
                       ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3_1.descriptor);
    __end3_1._0_8_ = IVar11.descriptor;
    field_1._0_4_ = IVar11.idx;
    while (bVar1 = cpp::operator!=((Iterator *)&__end3_1.descriptor,(Iterator *)&field_1), bVar1) {
      pFVar5 = FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                         ((Iterator *)&__end3_1.descriptor);
      bVar1 = IsFieldStripped(pFVar5,&this->options_);
      if (!bVar1) {
        pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
        (*pFVar6->_vptr_FieldGenerator[8])
                  (pFVar6,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
                ((Iterator *)&__end3_1.descriptor);
    }
    __begin3_2.descriptor =
         (Descriptor *)FieldRange<google::protobuf::Descriptor>(this->descriptor_);
    IVar11 = FieldRangeImpl<google::protobuf::Descriptor>::begin
                       ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3_2.descriptor);
    __begin3_2._0_8_ = IVar11.descriptor;
    __end3_2.descriptor._0_4_ = IVar11.idx;
    IVar11 = FieldRangeImpl<google::protobuf::Descriptor>::end
                       ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3_2.descriptor);
    __end3_2._0_8_ = IVar11.descriptor;
    field_2._0_4_ = IVar11.idx;
    while (bVar1 = cpp::operator!=((Iterator *)&__end3_2.descriptor,(Iterator *)&field_2), bVar1) {
      pFVar5 = FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                         ((Iterator *)&__end3_2.descriptor);
      bVar1 = IsFieldStripped(pFVar5,&this->options_);
      if (!bVar1) {
        pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFVar5);
        (*pFVar6->_vptr_FieldGenerator[7])
                  (pFVar6,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar1 = anon_unknown_0::IsCrossFileMaybeMap(pFVar5);
        if (bVar1) {
          Formatter::SaveState::SaveState
                    ((SaveState *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (Formatter *)local_50);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_228);
          SetCommonFieldVariables
                    (pFVar5,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_228,&this->options_);
          pOVar7 = FieldDescriptor::real_containing_oneof(pFVar5);
          if (pOVar7 != (OneofDescriptor *)0x0) {
            SetCommonOneofFieldVariables
                      (pFVar5,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_228);
          }
          Formatter::AddMap((Formatter *)local_50,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_228);
          Formatter::Formatter(&local_260,(Formatter *)local_50);
          GenerateFieldClear(this,pFVar5,false,&local_260);
          Formatter::~Formatter(&local_260);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_228);
          Formatter::SaveState::~SaveState
                    ((SaveState *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
      }
      FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
                ((Iterator *)&__end3_2.descriptor);
    }
    GenerateStructors(this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    Formatter::operator()<>((Formatter *)local_50,"\n");
    iVar2 = Descriptor::real_oneof_decl_count(this->descriptor_);
    if (0 < iVar2) {
      GenerateOneofClear(this,(Printer *)
                              format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Formatter::operator()<>((Formatter *)local_50,"\n");
    }
    pFVar8 = Descriptor::file(this->descriptor_);
    bVar1 = HasGeneratedMethods(pFVar8,&this->options_);
    if (bVar1) {
      GenerateClear(this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Formatter::operator()<>((Formatter *)local_50,"\n");
      bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
      if (!bVar1) {
        pPVar9 = std::
                 unique_ptr<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 ::operator->(&this->parse_function_generator_);
        ParseFunctionGenerator::GenerateMethodImpls
                  (pPVar9,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Formatter::operator()<>((Formatter *)local_50,"\n");
        pPVar9 = std::
                 unique_ptr<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
                 ::operator->(&this->parse_function_generator_);
        ParseFunctionGenerator::GenerateDataDefinitions
                  (pPVar9,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      GenerateSerializeWithCachedSizesToArray
                (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Formatter::operator()<>((Formatter *)local_50,"\n");
      GenerateByteSize(this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count
                      );
      Formatter::operator()<>((Formatter *)local_50,"\n");
      GenerateMergeFrom(this,(Printer *)
                             format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Formatter::operator()<>((Formatter *)local_50,"\n");
      GenerateClassSpecificMergeFrom
                (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Formatter::operator()<>((Formatter *)local_50,"\n");
      GenerateCopyFrom(this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count
                      );
      Formatter::operator()<>((Formatter *)local_50,"\n");
      GenerateIsInitialized
                (this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Formatter::operator()<>((Formatter *)local_50,"\n");
    }
    GenerateVerify(this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    GenerateSwap(this,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Formatter::operator()<>((Formatter *)local_50,"\n");
    if (((this->options_).table_driven_serialization & 1U) != 0) {
      Formatter::operator()
                ((Formatter *)local_50,
                 "const void* $classname$::InternalGetTable() const {\n  return ::$tablename$::serialization_table + $1$;\n}\n\n"
                 ,&this->index_in_file_messages_);
    }
    pFVar8 = Descriptor::file(this->descriptor_);
    bVar1 = HasDescriptorMethods(pFVar8,&this->options_);
    if (bVar1) {
      pMVar10 = Descriptor::options(this->descriptor_);
      bVar1 = MessageOptions::map_entry(pMVar10);
      if (bVar1) {
        Formatter::operator()
                  ((Formatter *)local_50,
                   "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
                   ,&this->index_in_file_messages_);
      }
      else {
        Formatter::operator()
                  ((Formatter *)local_50,
                   "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n$annotate_reflection$  return ::$proto_ns$::internal::AssignDescriptors(\n      &$desc_table$_getter, &$desc_table$_once,\n      $file_level_metadata$[$1$]);\n}\n"
                   ,&this->index_in_file_messages_);
      }
    }
    else {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "std::string $classname$::GetTypeName() const {\n  return \"$full_name$\";\n}\n\n")
      ;
    }
    if (((this->options_).field_listener_options.inject_field_listener_events & 1U) != 0) {
      pFVar8 = Descriptor::file(this->descriptor_);
      this_00 = FileDescriptor::options(pFVar8);
      FVar3 = FileOptions::optimize_for(this_00);
      if (FVar3 != FileOptions_OptimizeMode_LITE_RUNTIME) {
        ClassName_abi_cxx11_(&local_280,(cpp *)this->descriptor_,descriptor);
        Formatter::operator()
                  ((Formatter *)local_50,
                   "::$proto_ns$::AccessListener<$classtype$> $1$::_tracker_(&FullMessageName);\n",
                   &local_280);
        std::__cxx11::string::~string((string *)&local_280);
      }
    }
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MessageGenerator::GenerateClassMethods(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (IsMapEntryMessage(descriptor_)) {
    format(
        "$classname$::$classname$() {}\n"
        "$classname$::$classname$(::$proto_ns$::Arena* arena)\n"
        "    : SuperType(arena) {}\n"
        "void $classname$::MergeFrom(const $classname$& other) {\n"
        "  MergeFromInternal(other);\n"
        "}\n");
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      if (!descriptor_->options().map_entry()) {
        format(
            "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
            "$annotate_reflection$"
            "  return ::$proto_ns$::internal::AssignDescriptors(\n"
            "      &$desc_table$_getter, &$desc_table$_once,\n"
            "      $file_level_metadata$[$1$]);\n"
            "}\n",
            index_in_file_messages_);
      } else {
        format(
            "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
            "  return ::$proto_ns$::internal::AssignDescriptors(\n"
            "      &$desc_table$_getter, &$desc_table$_once,\n"
            "      $file_level_metadata$[$1$]);\n"
            "}\n",
            index_in_file_messages_);
      }
    }
    return;
  }

  if (IsAnyMessage(descriptor_, options_)) {
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      format(
          "bool $classname$::GetAnyFieldDescriptors(\n"
          "    const ::$proto_ns$::Message& message,\n"
          "    const ::$proto_ns$::FieldDescriptor** type_url_field,\n"
          "    const ::$proto_ns$::FieldDescriptor** value_field) {\n"
          "  return ::$proto_ns$::internal::GetAnyFieldDescriptors(\n"
          "      message, type_url_field, value_field);\n"
          "}\n");
    }
    format(
        "bool $classname$::ParseAnyTypeUrl(\n"
        "    ::PROTOBUF_NAMESPACE_ID::ConstStringParam type_url,\n"
        "    std::string* full_type_name) {\n"
        "  return ::$proto_ns$::internal::ParseAnyTypeUrl(type_url,\n"
        "                                             full_type_name);\n"
        "}\n"
        "\n");
  }

  format(
      "class $classname$::_Internal {\n"
      " public:\n");
  format.Indent();
  if (!has_bit_indices_.empty()) {
    format(
        "using HasBits = decltype(std::declval<$classname$>()._has_bits_);\n");
  }
  for (auto field : FieldRange(descriptor_)) {
    field_generators_.get(field).GenerateInternalAccessorDeclarations(printer);
    if (IsFieldStripped(field, options_)) {
      continue;
    }
    if (HasHasbit(field)) {
      int has_bit_index = HasBitIndex(field);
      GOOGLE_CHECK_NE(has_bit_index, kNoHasbit) << field->full_name();
      format(
          "static void set_has_$1$(HasBits* has_bits) {\n"
          "  (*has_bits)[$2$] |= $3$u;\n"
          "}\n",
          FieldName(field), has_bit_index / 32, (1u << (has_bit_index % 32)));
    }
  }
  if (num_required_fields_ > 0) {
    const std::vector<uint32_t> masks_for_has_bits = RequiredFieldsBitMask();
    format(
        "static bool MissingRequiredFields(const HasBits& has_bits) "
        "{\n"
        "  return $1$;\n"
        "}\n",
        ConditionalToCheckBitmasks(masks_for_has_bits, false, "has_bits"));
  }

  format.Outdent();
  format("};\n\n");
  for (auto field : FieldRange(descriptor_)) {
    if (!IsFieldStripped(field, options_)) {
      field_generators_.get(field).GenerateInternalAccessorDefinitions(printer);
    }
  }

  // Generate non-inline field definitions.
  for (auto field : FieldRange(descriptor_)) {
    if (IsFieldStripped(field, options_)) {
      continue;
    }
    field_generators_.get(field).GenerateNonInlineAccessorDefinitions(printer);
    if (IsCrossFileMaybeMap(field)) {
      Formatter::SaveState saver(&format);
      std::map<std::string, std::string> vars;
      SetCommonFieldVariables(field, &vars, options_);
      if (field->real_containing_oneof()) {
        SetCommonOneofFieldVariables(field, &vars);
      }
      format.AddMap(vars);
      GenerateFieldClear(field, false, format);
    }
  }

  GenerateStructors(printer);
  format("\n");

  if (descriptor_->real_oneof_decl_count() > 0) {
    GenerateOneofClear(printer);
    format("\n");
  }

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    GenerateClear(printer);
    format("\n");

    if (!HasSimpleBaseClass(descriptor_, options_)) {
      parse_function_generator_->GenerateMethodImpls(printer);
      format("\n");

      parse_function_generator_->GenerateDataDefinitions(printer);
    }

    GenerateSerializeWithCachedSizesToArray(printer);
    format("\n");

    GenerateByteSize(printer);
    format("\n");

    GenerateMergeFrom(printer);
    format("\n");

    GenerateClassSpecificMergeFrom(printer);
    format("\n");

    GenerateCopyFrom(printer);
    format("\n");

    GenerateIsInitialized(printer);
    format("\n");
  }

  GenerateVerify(printer);

  GenerateSwap(printer);
  format("\n");

  if (options_.table_driven_serialization) {
    format(
        "const void* $classname$::InternalGetTable() const {\n"
        "  return ::$tablename$::serialization_table + $1$;\n"
        "}\n"
        "\n",
        index_in_file_messages_);
  }
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    if (!descriptor_->options().map_entry()) {
      format(
          "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
          "$annotate_reflection$"
          "  return ::$proto_ns$::internal::AssignDescriptors(\n"
          "      &$desc_table$_getter, &$desc_table$_once,\n"
          "      $file_level_metadata$[$1$]);\n"
          "}\n",
          index_in_file_messages_);
    } else {
      format(
          "::$proto_ns$::Metadata $classname$::GetMetadata() const {\n"
          "  return ::$proto_ns$::internal::AssignDescriptors(\n"
          "      &$desc_table$_getter, &$desc_table$_once,\n"
          "      $file_level_metadata$[$1$]);\n"
          "}\n",
          index_in_file_messages_);
    }
  } else {
    format(
        "std::string $classname$::GetTypeName() const {\n"
        "  return \"$full_name$\";\n"
        "}\n"
        "\n");
  }

  if (options_.field_listener_options.inject_field_listener_events &&
      descriptor_->file()->options().optimize_for() !=
          google::protobuf::FileOptions::LITE_RUNTIME) {
    format(
        "::$proto_ns$::AccessListener<$classtype$> "
        "$1$::_tracker_(&FullMessageName);\n",
        ClassName(descriptor_));
  }
}